

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined2 *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  ulong *puVar10;
  undefined2 *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  bool bVar16;
  
  if (bmi2 != 0) {
    sVar5 = HUF_decompress1X2_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar5;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar6 = 0;
    uVar15 = 0;
    puVar14 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puVar10 = (ulong *)0x0;
  }
  else {
    puVar10 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar15 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar15 = uVar15 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar15 = uVar15 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar15 = uVar15 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar15 = uVar15 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar15 = uVar15 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar15 = uVar15 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar3 = 0x1f;
        if (bVar7 != 0) {
          for (; bVar7 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        if (bVar7 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar3 = 0;
        }
        else {
          uVar3 = ~uVar3 + (int)cSrcSize * -8 + 0x49;
        }
        uVar6 = (ulong)uVar3;
        puVar14 = (ulong *)cSrc;
      }
    }
    else {
      puVar14 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar15 = *puVar14;
      bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar3 = 0x1f;
      if (bVar7 != 0) {
        for (; bVar7 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = ~uVar3 + 9;
      if (bVar7 == 0) {
        uVar3 = 0;
      }
      uVar6 = (ulong)uVar3;
      cSrcSize = cSrcSize | -(ulong)(bVar7 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined2 *)((long)dst + dstSize);
  uVar3 = *DTable;
  puVar11 = (undefined2 *)((long)dst + (dstSize - 7));
  bVar7 = -(char)(uVar3 >> 0x10) & 0x3f;
  do {
    uVar4 = (uint)uVar6;
    if (uVar4 < 0x41) {
      if (puVar14 < puVar10) {
        if (puVar14 == (ulong *)cSrc) goto LAB_0015d566;
        bVar16 = cSrc <= (ulong *)((long)puVar14 - (uVar6 >> 3));
        uVar8 = (int)puVar14 - (int)cSrc;
        if (bVar16) {
          uVar8 = (uint)(uVar6 >> 3);
        }
        uVar4 = uVar4 + uVar8 * -8;
      }
      else {
        uVar8 = (uint)(uVar6 >> 3);
        uVar4 = uVar4 & 7;
        bVar16 = true;
      }
      uVar6 = (ulong)uVar4;
      puVar14 = (ulong *)((long)puVar14 - (ulong)uVar8);
      uVar15 = *puVar14;
    }
    else {
LAB_0015d566:
      bVar16 = false;
    }
    if ((puVar11 <= dst) || (!bVar16)) {
      puVar11 = puVar1 + -1;
      break;
    }
    if ((uVar3 & 0xff0000) == 0) goto LAB_0015d7c9;
    uVar12 = (uVar15 << ((byte)uVar6 & 0x3f)) >> bVar7;
    *(short *)dst = (short)DTable[uVar12 + 1];
    iVar9 = (uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + (int)uVar6;
    uVar6 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
    uVar12 = (uVar15 << ((byte)iVar9 & 0x3f)) >> bVar7;
    *(short *)((long)dst + uVar6) = (short)DTable[uVar12 + 1];
    iVar9 = (uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + iVar9;
    uVar13 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
    lVar2 = uVar13 + uVar6;
    uVar12 = (uVar15 << ((byte)iVar9 & 0x3f)) >> bVar7;
    *(short *)((long)dst + uVar13 + uVar6) = (short)DTable[uVar12 + 1];
    iVar9 = (uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + iVar9;
    uVar13 = (uVar15 << ((byte)iVar9 & 0x3f)) >> bVar7;
    uVar12 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
    *(short *)((long)dst + uVar12 + lVar2) = (short)DTable[uVar13 + 1];
    uVar6 = (ulong)((uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar9);
    dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7) + uVar12 + lVar2);
  } while( true );
LAB_0015d686:
  uVar4 = (uint)uVar6;
  if (uVar4 < 0x41) {
    if (puVar14 < puVar10) {
      if (puVar14 == (ulong *)cSrc) goto LAB_0015d68b;
      bVar16 = cSrc <= (ulong *)((long)puVar14 - (uVar6 >> 3));
      uVar8 = (int)puVar14 - (int)cSrc;
      if (bVar16) {
        uVar8 = (uint)(uVar6 >> 3);
      }
      uVar4 = uVar4 + uVar8 * -8;
    }
    else {
      uVar8 = (uint)(uVar6 >> 3);
      uVar4 = uVar4 & 7;
      bVar16 = true;
    }
    uVar6 = (ulong)uVar4;
    puVar14 = (ulong *)((long)puVar14 - (ulong)uVar8);
    uVar15 = *puVar14;
  }
  else {
LAB_0015d68b:
    bVar16 = false;
  }
  uVar4 = (uint)uVar6;
  if ((puVar11 < dst) || (!bVar16)) {
    if (puVar11 < dst) goto LAB_0015d754;
    if ((uVar3 & 0xff0000) != 0) goto LAB_0015d727;
    goto LAB_0015d7c9;
  }
  if ((uVar3 & 0xff0000) == 0) goto LAB_0015d7c9;
  uVar12 = (uVar15 << ((byte)uVar6 & 0x3f)) >> bVar7;
  *(short *)dst = (short)DTable[uVar12 + 1];
  uVar6 = (ulong)(uVar4 + *(byte *)((long)DTable + uVar12 * 4 + 6));
  dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7));
  goto LAB_0015d686;
LAB_0015d727:
  do {
    uVar12 = (uVar15 << ((byte)uVar6 & 0x3f)) >> bVar7;
    *(short *)dst = (short)DTable[uVar12 + 1];
    uVar4 = (int)uVar6 + (uint)*(byte *)((long)DTable + uVar12 * 4 + 6);
    uVar6 = (ulong)uVar4;
    dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7));
  } while (dst <= puVar11);
LAB_0015d754:
  if (dst < puVar1) {
    if ((uVar3 & 0xff0000) == 0) {
LAB_0015d7c9:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    uVar15 = (uVar15 << ((byte)uVar4 & 0x3f)) >> bVar7;
    *(char *)dst = (char)DTable[uVar15 + 1];
    if (*(char *)((long)DTable + uVar15 * 4 + 7) == '\x01') {
      uVar4 = uVar4 + *(byte *)((long)DTable + uVar15 * 4 + 6);
    }
    else if (uVar4 < 0x40) {
      uVar3 = uVar4 + *(byte *)((long)DTable + uVar15 * 4 + 6);
      uVar4 = 0x40;
      if (uVar3 < 0x40) {
        uVar4 = uVar3;
      }
    }
  }
  if (uVar4 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar14 != (ulong *)cSrc) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)
HUF_DGEN(HUF_decompress4X2_usingDTable_internal)

size_t HUF_decompress1X2_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 1) return ERROR(GENERIC);
    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}